

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O0

Index __thiscall
BayesianGameCollaborativeGraphical::JointToGroupActionIndex
          (BayesianGameCollaborativeGraphical *this,Index e,Index jaI)

{
  Index IVar1;
  const_reference ppBVar2;
  uint in_ESI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  Index jaGI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> restrictedIndivActions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indActions;
  Index in_stack_ffffffffffffff94;
  BayesianGameCollaborativeGraphical *this_00;
  undefined1 local_48 [24];
  Index in_stack_ffffffffffffffdc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffe0;
  
  this_00 = (BayesianGameCollaborativeGraphical *)&stack0xffffffffffffffd0;
  BayesianGameBase::JointToIndividualActionIndices
            ((BayesianGameBase *)this_00,in_stack_ffffffffffffff94);
  RestrictIndividualIndicesToScope<unsigned_int>
            (this_00,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  ppBVar2 = std::
            vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>::
            operator[]((vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                        *)&in_RDI[9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(ulong)in_ESI);
  IVar1 = (*((*ppBVar2)->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[7])(*ppBVar2,local_48);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_RDI);
  return IVar1;
}

Assistant:

Index BayesianGameCollaborativeGraphical::
JointToGroupActionIndex(Index e, Index jaI) const
{
    const vector<Index> &indActions = JointToIndividualActionIndices(jaI);
    vector<Index> restrictedIndivActions = RestrictIndividualIndicesToScope(
            indActions, e);    
    Index jaGI = _m_LRFs[e]->
        IndividualToJointActionIndices(restrictedIndivActions);
    return(jaGI);
}